

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_effect.cpp
# Opt level: O3

void P_RunEffects(void)

{
  long lVar1;
  AActor *actor;
  uint uVar2;
  int iVar3;
  TThinkerIterator<AActor> iterator;
  FThinkerIterator FStack_38;
  
  lVar1 = (&DAT_017e1fb8)[(long)consoleplayer * 0x54];
  if (lVar1 != 0) {
    if ((*(byte *)(lVar1 + 0x20) & 0x20) != 0) {
      (&DAT_017e1fb8)[(long)consoleplayer * 0x54] = 0;
      return;
    }
    iVar3 = (int)((ulong)(*(long *)(lVar1 + 0x130) - (long)sectors) >> 3) * numsectors;
    FThinkerIterator::FThinkerIterator(&FStack_38,AActor::RegistrationInfo.MyClass,0x80);
    actor = (AActor *)FThinkerIterator::Next(&FStack_38,false);
    if (actor != (AActor *)0x0) {
      do {
        if ((actor->effects != 0) &&
           ((rejectmatrix == (BYTE *)0x0 ||
            (uVar2 = (int)((ulong)((long)actor->Sector - (long)sectors) >> 3) * 0x7a44c6b +
                     iVar3 * 0x7a44c6b, (rejectmatrix[(int)uVar2 >> 3] >> (uVar2 & 7) & 1) == 0))))
        {
          P_RunEffect(actor,actor->effects);
        }
        actor = (AActor *)FThinkerIterator::Next(&FStack_38,false);
      } while (actor != (AActor *)0x0);
    }
  }
  return;
}

Assistant:

void P_RunEffects ()
{
	if (players[consoleplayer].camera == NULL) return;

	int	pnum = int(players[consoleplayer].camera->Sector - sectors) * numsectors;

	AActor *actor;
	TThinkerIterator<AActor> iterator;

	while ( (actor = iterator.Next ()) )
	{
		if (actor->effects)
		{
			// Only run the effect if the actor is potentially visible
			int rnum = pnum + int(actor->Sector - sectors);
			if (rejectmatrix == NULL || !(rejectmatrix[rnum>>3] & (1 << (rnum & 7))))
				P_RunEffect (actor, actor->effects);
		}
	}
}